

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma__is_channel_map_valid(ma_channel *channelMap,ma_uint32 channels)

{
  ulong uVar1;
  ma_channel *pmVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (*channelMap != '\0') {
    if (channels == 0) {
      return 0;
    }
    uVar1 = (ulong)channels;
    pmVar2 = channelMap + 1;
    uVar4 = 0;
    uVar3 = uVar1;
    do {
      uVar3 = uVar3 - 1;
      uVar5 = uVar4 + 1;
      if (uVar5 < uVar1) {
        uVar6 = 0;
        do {
          if (channelMap[uVar4] == pmVar2[uVar6]) {
            return 0;
          }
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
      pmVar2 = pmVar2 + 1;
      uVar4 = uVar5;
    } while (uVar5 != uVar1);
  }
  return 1;
}

Assistant:

static ma_bool32 ma__is_channel_map_valid(const ma_channel* channelMap, ma_uint32 channels)
{
    /* A blank channel map should be allowed, in which case it should use an appropriate default which will depend on context. */
    if (channelMap[0] != MA_CHANNEL_NONE) {
        ma_uint32 iChannel;

        if (channels == 0) {
            return MA_FALSE;   /* No channels. */
        }

        /* A channel cannot be present in the channel map more than once. */
        for (iChannel = 0; iChannel < channels; ++iChannel) {
            ma_uint32 jChannel;
            for (jChannel = iChannel + 1; jChannel < channels; ++jChannel) {
                if (channelMap[iChannel] == channelMap[jChannel]) {
                    return MA_FALSE;
                }
            }
        }
    }

    return MA_TRUE;
}